

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>::
AdapterPromiseNode<kj::Canceler&,kj::Promise<unsigned_long>>
          (AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>> *this,
          Canceler *params,Promise<unsigned_long> *params_1)

{
  PromiseNode *pPVar1;
  Promise<unsigned_long> local_20;
  
  *(undefined8 *)(this + 8) = 0;
  *(undefined ***)this = &PTR_onReady_0064ffc0;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_00650008;
  this[0x18] = (AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>)0x0;
  this[0x178] = (AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>)0x0;
  this[0x188] = (AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>)0x1;
  local_20.super_PromiseBase.node.disposer = (params_1->super_PromiseBase).node.disposer;
  local_20.super_PromiseBase.node.ptr = (params_1->super_PromiseBase).node.ptr;
  (params_1->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  Canceler::AdapterImpl<unsigned_long>::AdapterImpl
            ((AdapterImpl<unsigned_long> *)(this + 400),
             (PromiseFulfiller<unsigned_long> *)(this + 0x10),params,&local_20);
  pPVar1 = local_20.super_PromiseBase.node.ptr;
  if (local_20.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_20.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_20.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_20.super_PromiseBase.node.disposer,
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}